

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gaussian_mixture_model_based_conversion.cc
# Opt level: O1

void __thiscall
sptk::GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion
          (GaussianMixtureModelBasedConversion *this,int num_source_order,int num_target_order,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *window_coefficients,vector<double,_std::allocator<double>_> *weights,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *mean_vectors,
          vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *covariance_matrices
          ,bool use_magic_number,double magic_number)

{
  uint uVar1;
  pointer pvVar2;
  void *__src;
  long lVar3;
  pointer pMVar4;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *pvVar5;
  bool bVar6;
  int iVar7;
  double *pdVar8;
  long lVar9;
  int iVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  int m_1;
  int iVar15;
  long lVar16;
  int m;
  double dVar17;
  SymmetricMatrix xx;
  double local_100;
  Row local_f8;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_e0;
  vector<double,_std::allocator<double>_> *local_d8;
  int local_cc;
  double local_c8;
  int local_bc;
  undefined1 local_b8 [16];
  int local_a8;
  Row local_78;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_60;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_58;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *local_50;
  long local_48;
  vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_> *local_40;
  vector<sptk::Matrix,_std::allocator<sptk::Matrix>_> *local_38;
  
  this->_vptr_GaussianMixtureModelBasedConversion =
       (_func_int **)&PTR__GaussianMixtureModelBasedConversion_0011fa00;
  this->num_source_order_ = num_source_order;
  this->num_target_order_ = num_target_order;
  iVar7 = (int)((ulong)((long)(window_coefficients->
                              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                       (long)(window_coefficients->
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555 + 1;
  this->source_length_ = (num_source_order + 1) * iVar7;
  this->target_length_ = (num_target_order + 1) * iVar7;
  local_50 = mean_vectors;
  std::vector<double,_std::allocator<double>_>::vector(&this->weights_,weights);
  this->use_magic_number_ = use_magic_number;
  this->magic_number_ = magic_number;
  this->num_mixture_ =
       (int)((ulong)((long)(this->weights_).super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->weights_).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start) >> 3);
  NonrecursiveMaximumLikelihoodParameterGeneration::NonrecursiveMaximumLikelihoodParameterGeneration
            (&this->mlpg_,this->num_target_order_,window_coefficients,use_magic_number,magic_number)
  ;
  this->is_valid_ = true;
  iVar7 = this->num_mixture_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_b8,(long)this->source_length_,
             (allocator_type *)&local_f8);
  local_58 = &this->source_mean_vectors_;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(local_58,(long)iVar7,(value_type *)local_b8,(allocator_type *)&local_78);
  if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_b8._0_8_);
  }
  iVar7 = this->num_mixture_;
  SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_b8,this->source_length_);
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            (&this->source_covariance_matrices_,(long)iVar7,(value_type *)local_b8,
             (allocator_type *)&local_f8);
  SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_b8);
  iVar7 = this->num_mixture_;
  Matrix::Matrix((Matrix *)local_b8,this->target_length_,this->source_length_);
  local_38 = &this->e_slope_;
  std::vector<sptk::Matrix,_std::allocator<sptk::Matrix>_>::vector
            (local_38,(long)iVar7,(value_type *)local_b8,(allocator_type *)&local_f8);
  Matrix::~Matrix((Matrix *)local_b8);
  iVar7 = this->num_mixture_;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_b8,(long)this->target_length_,
             (allocator_type *)&local_f8);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&this->e_bias_,(long)iVar7,(value_type *)local_b8,(allocator_type *)&local_78);
  if ((_func_int **)local_b8._0_8_ != (_func_int **)0x0) {
    operator_delete((void *)local_b8._0_8_);
  }
  iVar7 = this->num_mixture_;
  SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_b8,this->target_length_);
  local_40 = &this->d_;
  local_e0 = &this->e_bias_;
  local_d8 = &this->weights_;
  std::vector<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>::vector
            (local_40,(long)iVar7,(value_type *)local_b8,(allocator_type *)&local_f8);
  SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_b8);
  if ((((this->num_source_order_ < 0) || (this->num_target_order_ < 0)) || (this->num_mixture_ < 1))
     || ((this->mlpg_).is_valid_ != true)) {
LAB_0010789f:
    this->is_valid_ = false;
  }
  else if (0 < this->num_mixture_) {
    lVar13 = 0;
    local_60 = &this->source_covariance_matrices_;
    do {
      pvVar5 = local_60;
      iVar7 = this->source_length_;
      lVar9 = (long)this->target_length_ + (long)iVar7;
      pvVar2 = (local_50->
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      __src = pvVar2[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
      if (((long)*(pointer *)
                  ((long)&pvVar2[lVar13].super__Vector_base<double,_std::allocator<double>_>._M_impl
                          .super__Vector_impl_data + 8) - (long)__src >> 3 != lVar9) ||
         ((covariance_matrices->
          super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>)._M_impl
          .super__Vector_impl_data._M_start[lVar13].num_dimension_ != (int)lVar9))
      goto LAB_0010789f;
      local_48 = lVar13;
      if (iVar7 != 0) {
        memmove((local_58->
                super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[lVar13].
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start,__src,(long)iVar7 << 3);
      }
      iVar7 = this->source_length_;
      if (0 < iVar7) {
        iVar10 = 0;
        iVar15 = 1;
        do {
          iVar7 = 0;
          do {
            local_b8._8_8_ =
                 (covariance_matrices->
                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
                 _M_impl.super__Vector_impl_data._M_start + lVar13;
            local_b8._0_8_ = &PTR__Row_0011fac0;
            local_a8 = iVar10;
            pdVar8 = SymmetricMatrix::Row::operator[]((Row *)local_b8,iVar7);
            dVar17 = *pdVar8;
            local_f8.matrix_ =
                 (pvVar5->
                 super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>).
                 _M_impl.super__Vector_impl_data._M_start + lVar13;
            local_f8._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
            local_f8.row_ = iVar10;
            pdVar8 = SymmetricMatrix::Row::operator[](&local_f8,iVar7);
            *pdVar8 = dVar17;
            iVar7 = iVar7 + 1;
          } while (iVar15 != iVar7);
          iVar10 = iVar10 + 1;
          iVar7 = this->source_length_;
          iVar15 = iVar15 + 1;
        } while (iVar10 < iVar7);
      }
      SymmetricMatrix::SymmetricMatrix((SymmetricMatrix *)local_b8,iVar7);
      bVar6 = SymmetricMatrix::Invert
                        ((pvVar5->
                         super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar13,
                         (SymmetricMatrix *)local_b8);
      if (bVar6) {
        uVar12 = this->target_length_;
        if (0 < (int)uVar12) {
          lVar9 = 0;
          do {
            iVar7 = this->source_length_;
            if (0 < iVar7) {
              lVar16 = 0;
              do {
                if (0 < this->source_length_) {
                  iVar10 = 0;
                  do {
                    local_f8.matrix_ =
                         (covariance_matrices->
                         super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                         )._M_impl.super__Vector_impl_data._M_start + lVar13;
                    local_f8._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                    local_f8.row_ = iVar7 + (int)lVar9;
                    pdVar8 = SymmetricMatrix::Row::operator[](&local_f8,iVar10);
                    dVar17 = *pdVar8;
                    local_78._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                    local_78.matrix_ = (SymmetricMatrix *)local_b8;
                    local_78.row_ = iVar10;
                    pdVar8 = SymmetricMatrix::Row::operator[](&local_78,(int)lVar16);
                    lVar3 = *(long *)(*(long *)&(this->e_slope_).
                                                super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>
                                                ._M_impl.super__Vector_impl_data._M_start[lVar13].
                                                index_.
                                                super__Vector_base<double_*,_std::allocator<double_*>_>
                                                ._M_impl + lVar9 * 8);
                    *(double *)(lVar3 + lVar16 * 8) =
                         dVar17 * *pdVar8 + *(double *)(lVar3 + lVar16 * 8);
                    iVar10 = iVar10 + 1;
                  } while (iVar10 < this->source_length_);
                }
                lVar16 = lVar16 + 1;
              } while (lVar16 < this->source_length_);
            }
            lVar9 = lVar9 + 1;
            uVar12 = this->target_length_;
          } while (lVar9 < (int)uVar12);
        }
        if (0 < (int)uVar12) {
          uVar1 = this->source_length_;
          pMVar4 = (this->e_slope_).super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pvVar2 = (local_50->
                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar9 = *(long *)&(this->e_bias_).
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[local_48].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data;
          lVar16 = *(long *)&pvVar2[local_48].super__Vector_base<double,_std::allocator<double>_>.
                             _M_impl.super__Vector_impl_data;
          uVar14 = 0;
          do {
            if ((int)uVar1 < 1) {
              dVar17 = 0.0;
            }
            else {
              dVar17 = 0.0;
              uVar11 = 0;
              do {
                dVar17 = dVar17 + *(double *)
                                   (*(long *)(*(long *)&pMVar4[lVar13].index_.
                                                                                                                
                                                  super__Vector_base<double_*,_std::allocator<double_*>_>
                                                  ._M_impl.super__Vector_impl_data + uVar14 * 8) +
                                   uVar11 * 8) *
                                  *(double *)
                                   (*(long *)&pvVar2[local_48].
                                              super__Vector_base<double,_std::allocator<double>_>.
                                              _M_impl.super__Vector_impl_data + uVar11 * 8);
                uVar11 = uVar11 + 1;
              } while (uVar1 != uVar11);
            }
            *(double *)(lVar9 + uVar14 * 8) =
                 *(double *)((long)(int)uVar1 * 8 + lVar16 + uVar14 * 8) - dVar17;
            uVar14 = uVar14 + 1;
          } while (uVar14 != uVar12);
        }
        if (0 < this->target_length_) {
          local_cc = 1;
          lVar9 = 0;
          do {
            local_bc = this->source_length_ + (int)lVar9;
            iVar7 = 0;
            do {
              iVar10 = this->source_length_ + iVar7;
              if (this->source_length_ < 1) {
                local_100 = 0.0;
              }
              else {
                local_100 = 0.0;
                lVar16 = 0;
                do {
                  local_c8 = *(double *)
                              (*(long *)(*(long *)&(local_38->
                                                                                                      
                                                  super__Vector_base<sptk::Matrix,_std::allocator<sptk::Matrix>_>
                                                  )._M_impl.super__Vector_impl_data._M_start[lVar13]
                                                  .index_.
                                                  super__Vector_base<double_*,_std::allocator<double_*>_>
                                                  ._M_impl + lVar9 * 8) + lVar16 * 8);
                  local_f8.matrix_ =
                       (covariance_matrices->
                       super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                       )._M_impl.super__Vector_impl_data._M_start + lVar13;
                  local_f8._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
                  local_f8.row_ = (int)lVar16;
                  pdVar8 = SymmetricMatrix::Row::operator[](&local_f8,iVar10);
                  local_100 = local_100 + local_c8 * *pdVar8;
                  lVar16 = lVar16 + 1;
                } while (lVar16 < this->source_length_);
              }
              local_f8.matrix_ =
                   (covariance_matrices->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar13;
              local_f8._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
              local_f8.row_ = local_bc;
              pdVar8 = SymmetricMatrix::Row::operator[](&local_f8,iVar10);
              local_c8 = *pdVar8;
              local_78.matrix_ =
                   (local_40->
                   super__Vector_base<sptk::SymmetricMatrix,_std::allocator<sptk::SymmetricMatrix>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar13;
              local_78._vptr_Row = (_func_int **)&PTR__Row_0011fac0;
              local_78.row_ = (int)lVar9;
              pdVar8 = SymmetricMatrix::Row::operator[](&local_78,iVar7);
              *pdVar8 = local_c8 - local_100;
              iVar7 = iVar7 + 1;
            } while (iVar7 != local_cc);
            lVar9 = lVar9 + 1;
            local_cc = local_cc + 1;
          } while (lVar9 < this->target_length_);
        }
      }
      else {
        this->is_valid_ = false;
      }
      SymmetricMatrix::~SymmetricMatrix((SymmetricMatrix *)local_b8);
    } while ((bVar6) && (lVar13 = local_48 + 1, lVar13 < this->num_mixture_));
  }
  return;
}

Assistant:

GaussianMixtureModelBasedConversion::GaussianMixtureModelBasedConversion(
    int num_source_order, int num_target_order,
    const std::vector<std::vector<double> >& window_coefficients,
    const std::vector<double>& weights,
    const std::vector<std::vector<double> >& mean_vectors,
    const std::vector<SymmetricMatrix>& covariance_matrices,
    bool use_magic_number, double magic_number)
    : num_source_order_(num_source_order),
      num_target_order_(num_target_order),
      source_length_((num_source_order_ + 1) *
                     (static_cast<int>(window_coefficients.size() + 1))),
      target_length_((num_target_order_ + 1) *
                     (static_cast<int>(window_coefficients.size() + 1))),
      weights_(weights),
      use_magic_number_(use_magic_number),
      magic_number_(magic_number),
      num_mixture_(static_cast<int>(weights_.size())),
      mlpg_(num_target_order_, window_coefficients, use_magic_number_,
            magic_number_),
      is_valid_(true),
      source_mean_vectors_(num_mixture_, std::vector<double>(source_length_)),
      source_covariance_matrices_(num_mixture_,
                                  SymmetricMatrix(source_length_)),
      e_slope_(num_mixture_, Matrix(target_length_, source_length_)),
      e_bias_(num_mixture_, std::vector<double>(target_length_)),
      d_(num_mixture_, SymmetricMatrix(target_length_)) {
  if (num_source_order_ < 0 || num_target_order_ < 0 || num_mixture_ <= 0 ||
      !mlpg_.IsValid()) {
    is_valid_ = false;
    return;
  }

  for (int k(0); k < num_mixture_; ++k) {
    // Check size of mean vectors and covariance matrices.
    const int total_length(source_length_ + target_length_);
    if (mean_vectors[k].size() != static_cast<std::size_t>(total_length) ||
        covariance_matrices[k].GetNumDimension() != total_length) {
      is_valid_ = false;
      return;
    }

    // Set \mu^{(X)}.
    std::copy(mean_vectors[k].begin(), mean_vectors[k].begin() + source_length_,
              source_mean_vectors_[k].begin());

    // Set \Sigma^{(XX)}.
    for (int l(0); l < source_length_; ++l) {
      for (int m(0); m <= l; ++m) {
        source_covariance_matrices_[k][l][m] = covariance_matrices[k][l][m];
      }
    }

    // Set \Sigma^{(YX)} \Sigma^{(XX)}^{-1}.
    SymmetricMatrix xx(source_length_);
    if (!source_covariance_matrices_[k].Invert(&xx)) {
      is_valid_ = false;
      return;
    }
    for (int l(0); l < target_length_; ++l) {
      const int ll(source_length_ + l);
      for (int m(0); m < source_length_; ++m) {
        for (int n(0); n < source_length_; ++n) {
          e_slope_[k][l][m] += covariance_matrices[k][ll][n] * xx[n][m];
        }
      }
    }

    // Set \mu^{(Y)} - \Sigma^{(YX)} \Sigma^{(XX)}^{-1} \mu^{(X)}
    for (int l(0); l < target_length_; ++l) {
      const int ll(l + source_length_);
      double tmp(0.0);
      for (int m(0); m < source_length_; ++m) {
        tmp += e_slope_[k][l][m] * mean_vectors[k][m];
      }
      e_bias_[k][l] = mean_vectors[k][ll] - tmp;
    }

    // Set D^{(Y)}.
    for (int l(0); l < target_length_; ++l) {
      const int ll(source_length_ + l);
      for (int m(0); m <= l; ++m) {
        const int mm(source_length_ + m);
        double tmp(0.0);
        for (int n(0); n < source_length_; ++n) {
          tmp += e_slope_[k][l][n] * covariance_matrices[k][n][mm];
        }
        d_[k][l][m] = covariance_matrices[k][ll][mm] - tmp;
      }
    }
  }
}